

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConnection.h
# Opt level: O1

string * __thiscall
cmConnectionBufferStrategy::BufferOutMessage
          (string *__return_storage_ptr__,cmConnectionBufferStrategy *this,string *rawBuffer)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (rawBuffer->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + rawBuffer->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string BufferOutMessage(const std::string& rawBuffer) const
  {
    return rawBuffer;
  }